

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav_ins_motion.c
# Opt level: O2

double fsnav_ins_motion_parse_double
                 (char *token,char *src,size_t len,double *range,double default_value)

{
  char *__nptr;
  double dVar1;
  
  __nptr = fsnav_locate_token(token,src,len,'=');
  if (__nptr != (char *)0x0) {
    dVar1 = atof(__nptr);
    if (range == (double *)0x0) {
      return dVar1;
    }
    if (((*range <= range[1]) && (*range <= dVar1)) && (dVar1 <= range[1])) {
      return dVar1;
    }
  }
  return default_value;
}

Assistant:

double fsnav_ins_motion_parse_double(const char *token, char *src, const size_t len, double *range, const double default_value) {

	char   *cfg_ptr; // pointer to a substring
	double  val;     // value

	// ensure variable to be initialized
	val = default_value;
	// parse token from src
	cfg_ptr = fsnav_locate_token(token, src, len, '=');
	if (cfg_ptr != NULL)
		val = atof(cfg_ptr);
	// if not found or out of range, set to default
	if ( cfg_ptr == NULL || (range != NULL && (range[0] > range[1] || val < range[0] || range[1] < val)) )
		val = default_value;
	return val;

}